

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

int __thiscall QByteArray::remove(QByteArray *this,char *__filename)

{
  initializer_list<QtPrivate::QPodArrayOps<char>::Span> ranges;
  bool bVar1;
  QPodArrayOps<char> *pQVar2;
  char *pcVar3;
  DataOps *pDVar4;
  long in_RDX;
  long in_FS_OFFSET;
  char *toRemove_start;
  QByteArray copy;
  QByteArray *in_stack_ffffffffffffff38;
  QArrayDataPointer<char> *in_stack_ffffffffffffff40;
  Initialization IVar5;
  QPodArrayOps<char> *this_00;
  int iVar6;
  iterator in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  QPodArrayOps<char> *in_stack_ffffffffffffff80;
  long local_68;
  QArrayDataPointer<char> local_48;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((0 < in_RDX) && (-1 < (long)__filename)) {
    this_00 = (QPodArrayOps<char> *)__filename;
    pQVar2 = (QPodArrayOps<char> *)size(this);
    if (this_00 < pQVar2) {
      pcVar3 = __filename + in_RDX;
      pDVar4 = QArrayDataPointer<char>::operator->(&this->d);
      local_68 = in_RDX;
      if ((pDVar4->super_QCommonArrayOps<char>).super_Type.super_QArrayDataPointer<char>.size <
          (long)pcVar3) {
        pDVar4 = QArrayDataPointer<char>::operator->(&this->d);
        local_68 = (pDVar4->super_QCommonArrayOps<char>).super_Type.super_QArrayDataPointer<char>.
                   size - (long)__filename;
      }
      IVar5 = (Initialization)((ulong)pcVar3 >> 0x20);
      pcVar3 = QArrayDataPointer<char>::begin((QArrayDataPointer<char> *)0x4b343e);
      QArrayDataPointer<char>::operator->(&this->d);
      bVar1 = QArrayDataPointer<char>::isShared(in_stack_ffffffffffffff40);
      if (bVar1) {
        local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        size(this);
        QByteArray(this,(qsizetype)this_00,IVar5);
        QArrayDataPointer<char>::operator->(&local_48);
        local_28 = QArrayDataPointer<char>::begin((QArrayDataPointer<char> *)0x4b34f9);
        local_18 = pcVar3 + (long)__filename + local_68;
        local_20 = pcVar3 + (long)__filename;
        local_10 = QArrayDataPointer<char>::end(in_stack_ffffffffffffff40);
        ranges._M_len = (size_type)in_stack_ffffffffffffff78;
        ranges._M_array = in_stack_ffffffffffffff70;
        QtPrivate::QPodArrayOps<char>::copyRanges(this_00,ranges);
        swap((QByteArray *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        ~QByteArray((QByteArray *)0x4b3580);
      }
      else {
        QArrayDataPointer<char>::operator->(&this->d);
        QtPrivate::QPodArrayOps<char>::erase
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (qsizetype)in_stack_ffffffffffffff70);
        pcVar3 = QArrayDataPointer<char>::data(&this->d);
        pcVar3[(this->d).size] = '\0';
      }
      iVar6 = (int)this;
      goto LAB_004b35ad;
    }
  }
  iVar6 = (int)this;
LAB_004b35ad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::remove(qsizetype pos, qsizetype len)
{
    if (len <= 0  || pos < 0 || size_t(pos) >= size_t(size()))
        return *this;
    if (pos + len > d->size)
        len = d->size - pos;

    const auto toRemove_start = d.begin() + pos;
    if (!d->isShared()) {
        d->erase(toRemove_start, len);
        d.data()[d.size] = '\0';
    } else {
        QByteArray copy{size() - len, Qt::Uninitialized};
        copy.d->copyRanges({{d.begin(), toRemove_start},
                           {toRemove_start + len, d.end()}});
        swap(copy);
    }
    return *this;
}